

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_extrude.cpp
# Opt level: O2

bool ON_BrepExtrudeHelper_MakeSides
               (ON_Brep *brep,int loop_index,ON_Curve *path_curve,bool bCap,
               ON_SimpleArray<int> *side_face_index)

{
  uint extruded_trim_count;
  int iVar1;
  TYPE TVar2;
  uint uVar3;
  ON_BrepTrim *pOVar4;
  ON_BrepEdge *pOVar5;
  long lVar6;
  ON_SumSurface *pSurface;
  ON_BrepFace *pOVar7;
  ulong uVar8;
  long lVar9;
  uint *puVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint local_90;
  undefined4 local_8c;
  ON_Brep *local_88;
  ulong local_80;
  int local_74;
  int local_70;
  int local_6c;
  int vid [4];
  int eid [4];
  
  extruded_trim_count =
       (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a
       [loop_index].m_ti.m_count;
  if ((long)(int)extruded_trim_count != 0) {
    local_74 = (brep->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
               m_count;
    local_70 = (brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
               m_count;
    local_88 = brep;
    ON_BrepExtrudeHelper_ReserveSpace(brep,extruded_trim_count,(uint)bCap);
    ON_SimpleArray<int>::Reserve
              (side_face_index,(long)side_face_index->m_count + (long)(int)extruded_trim_count);
    uVar13 = 0;
    if (0 < (int)extruded_trim_count) {
      uVar13 = (ulong)extruded_trim_count;
    }
    local_90 = 0xffffffff;
    uVar8 = 0xffffffff;
    local_80 = uVar13;
    for (uVar12 = 0; uVar12 != uVar13; uVar12 = uVar12 + 1) {
      uVar11 = uVar8 & 0xffffffff;
      local_6c = -1;
      ON_SimpleArray<int>::Append(side_face_index,&local_6c);
      iVar1 = (local_88->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a
              [loop_index].m_ti.m_a[uVar12];
      lVar6 = (long)iVar1;
      if ((-1 < lVar6) && (iVar1 < local_70)) {
        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
          vid[lVar9] = -1;
          eid[lVar9] = -1;
        }
        local_8c = 0;
        pOVar4 = (local_88->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                 m_a;
        lVar9 = (long)pOVar4[lVar6].m_ei;
        if ((-1 < lVar9) && (pOVar4[lVar6].m_ei < local_74)) {
          TVar2 = pOVar4[lVar6].m_type;
          if (TVar2 == seam) {
            uVar11 = 0xffffffffffffffff;
            uVar13 = local_80;
          }
          else {
            pOVar5 = (local_88->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                     super_ON_ClassArray<ON_BrepEdge>.m_a;
            vid[0] = pOVar4[lVar6].m_vi[1];
            vid[1] = pOVar4[lVar6].m_vi[0];
            eid[0] = pOVar5[lVar9].m_edge_index;
            local_8c = pOVar4[lVar6].m_bRev3d ^ 1;
            pSurface = ON_BrepExtrudeHelper_MakeSumSrf
                                 (path_curve,pOVar5 + lVar9,pOVar4[lVar6].m_bRev3d);
            uVar13 = local_80;
            if ((TVar2 != seam) && (pSurface != (ON_SumSurface *)0x0)) {
              if (-1 < (int)uVar8) {
                pOVar4 = (local_88->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                         super_ON_ClassArray<ON_BrepTrim>.m_a;
                iVar1 = (local_88->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                        super_ON_ClassArray<ON_BrepLoop>.m_a
                        [*(local_88->m_F).super_ON_ObjectArray<ON_BrepFace>.
                          super_ON_ClassArray<ON_BrepFace>.m_a[uVar11].m_li.m_a].m_ti.m_a[3];
                vid[2] = pOVar4[iVar1].m_vi[0];
                eid[1] = pOVar4[iVar1].m_ei;
                local_8c = CONCAT22(local_8c._2_2_,CONCAT11(pOVar4[iVar1].m_bRev3d,local_8c._0_1_))
                           ^ 0x100;
              }
              if (-1 < (int)local_90) {
                pOVar4 = (local_88->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                         super_ON_ClassArray<ON_BrepTrim>.m_a;
                uVar13 = (ulong)local_90;
                if (pOVar4[uVar13].m_vi[0] == vid[0]) {
                  vid[3] = pOVar4[uVar13].m_vi[1];
                  eid[3] = pOVar4[uVar13].m_ei;
                  local_8c = CONCAT13(pOVar4[uVar13].m_bRev3d,(undefined3)local_8c) ^ 0x1000000;
                }
              }
              pOVar7 = ON_Brep::NewFace(local_88,&pSurface->super_ON_Surface,vid,eid,
                                        (bool *)&local_8c);
              uVar13 = local_80;
              if (pOVar7 != (ON_BrepFace *)0x0) {
                uVar3 = pOVar7->m_face_index;
                puVar10 = (uint *)(side_face_index->m_a + (long)side_face_index->m_count + -1);
                if ((long)side_face_index->m_count < 1) {
                  puVar10 = (uint *)0x0;
                }
                *puVar10 = uVar3;
                uVar11 = (ulong)uVar3;
                if ((int)local_90 < 0) {
                  uVar11 = (ulong)uVar3;
                  local_90 = (local_88->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                             super_ON_ClassArray<ON_BrepLoop>.m_a[*(pOVar7->m_li).m_a].m_ti.m_a[1];
                }
              }
            }
          }
        }
      }
      uVar8 = uVar11;
    }
  }
  return extruded_trim_count != 0;
}

Assistant:

static
bool ON_BrepExtrudeHelper_MakeSides(
          ON_Brep& brep,
          int loop_index,
          const ON_Curve& path_curve,
          bool bCap,
          ON_SimpleArray<int>& side_face_index
          )
{
  int lti, ti, i, vid[4], eid[4];
  bool bRev3d[4];

  // indices of new faces appended to the side_face_index[] array 
  // (1 face index for each trim, -1 is used for singular trims)

  // count number of new objects so we can grow arrays
  // efficiently and use refs to dynamic array elements.
  const int loop_trim_count = brep.m_L[loop_index].m_ti.Count();
  if ( loop_trim_count == 0 )
    return false;

  // save input trim and edge counts for use below
  const int trim_count0 = brep.m_T.Count();
  const int edge_count0 = brep.m_E.Count();

  ON_BrepExtrudeHelper_ReserveSpace( brep, loop_trim_count, bCap?1:0 );

  side_face_index.Reserve( side_face_index.Count() + loop_trim_count); // index of new face above brep.m_L[loop_index].m_ti[lti]
  int prev_face_index = -1;
  int first_face_east_trim_index = -1;

  for ( lti = 0; lti < loop_trim_count; lti++ )
  {
    ON_SumSurface* sum_srf = 0;
    side_face_index.Append(-1);
    ti = brep.m_L[loop_index].m_ti[lti];
    if ( ti < 0 || ti >= trim_count0 )
      continue;

    for ( i = 0; i < 4; i++ )
    {
      vid[i] = -1;
      eid[i] = -1;
    }
    bRev3d[0] = false;
    bRev3d[1] = false;
    bRev3d[2] = false;
    bRev3d[3] = false;

    // get side surface for new face
    {
      ON_BrepTrim& trim = brep.m_T[ti];
      if ( trim.m_ei >= 0 &&  trim.m_ei < edge_count0 )
      {
        const ON_BrepEdge& base_edge = brep.m_E[trim.m_ei];

        // 5 September, 2003 Dale Lear
        //   do not extrude seams - fixes rectangle slabe bug
        if ( trim.m_type == ON_BrepTrim::seam )
        {
          prev_face_index = -1;
          continue;
        }

        // connect new face to existing topology on trim
        vid[0] = trim.m_vi[1];
        vid[1] = trim.m_vi[0];
        eid[0] = base_edge.m_edge_index;
        bRev3d[0] = (trim.m_bRev3d?false:true);
        sum_srf = ON_BrepExtrudeHelper_MakeSumSrf( path_curve, base_edge, trim.m_bRev3d );
      }
    }
    if ( !sum_srf )
      continue;

    if ( prev_face_index >= 0 )
    {
      const ON_BrepTrim& prev_west_trim = brep.m_T[ brep.m_L[ brep.m_F[prev_face_index].m_li[0]].m_ti[3] ];
      vid[2] = prev_west_trim.m_vi[0];
      eid[1] = prev_west_trim.m_ei;
      bRev3d[1] = (prev_west_trim.m_bRev3d?false:true);
    }
    if ( first_face_east_trim_index >= 0 && brep.m_T[first_face_east_trim_index].m_vi[0] == vid[0] )
    {
      const ON_BrepTrim& first_face_east_trim = brep.m_T[first_face_east_trim_index];
      vid[3] = first_face_east_trim.m_vi[1];
      eid[3] = first_face_east_trim.m_ei;
      bRev3d[3] = (first_face_east_trim.m_bRev3d?false:true);
    }
    const ON_BrepFace* side_face = brep.NewFace(sum_srf,vid,eid,bRev3d);
    if ( side_face )
    {
      *side_face_index.Last() = side_face->m_face_index;
      prev_face_index = side_face->m_face_index;
      if ( first_face_east_trim_index < 0 )
        first_face_east_trim_index = brep.m_L[ side_face->m_li[0] ].m_ti[1];
    }
  }

  return true;
}